

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

value_type *
winmd::reader::ElemSig::read_enum
          (value_type *__return_storage_ptr__,ElementType type,byte_view *data)

{
  undefined7 in_register_00000031;
  allocator<char> local_71;
  string local_70;
  unsigned_long local_50;
  long local_48;
  uint local_3c;
  int local_38;
  unsigned_short local_32;
  short local_30;
  uchar local_2e;
  char local_2d;
  char16_t local_2c;
  bool local_29;
  byte_view *local_28;
  byte_view *data_local;
  value_type *pvStack_18;
  ElementType type_local;
  
  local_28 = (byte_view *)CONCAT71(in_register_00000031,type);
  data_local._7_1_ = SUB81(__return_storage_ptr__,0);
  switch(data_local._7_1_) {
  case 2:
    local_29 = read<bool>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<bool,void,void,bool,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_29);
    break;
  case 3:
    local_2c = read<char16_t>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<char16_t,void,void,char16_t,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_2c);
    break;
  case 4:
    local_2d = read<signed_char>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<signed_char,void,void,signed_char,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_2d);
    break;
  case 5:
    local_2e = read<unsigned_char>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<unsigned_char,void,void,unsigned_char,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_2e);
    break;
  case 6:
    local_30 = read<short>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<short,void,void,short,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_30);
    break;
  case 7:
    local_32 = read<unsigned_short>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<unsigned_short,void,void,unsigned_short,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_32);
    break;
  case 8:
    local_38 = read<int>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<int,void,void,int,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_38);
    break;
  case 9:
    local_3c = read<unsigned_int>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<unsigned_int,void,void,unsigned_int,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_3c);
    break;
  case 10:
    local_48 = read<long>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<long,void,void,long,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_48);
    break;
  case 0xb:
    local_50 = read<unsigned_long>(local_28);
    std::
    variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
    ::variant<unsigned_long,void,void,unsigned_long,void>
              ((variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long>
                *)&stack0xffffffffffffffe8,&local_50);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Invalid underling enum type encountered",&local_71);
    impl::throw_invalid(&local_70);
  }
  return pvStack_18;
}

Assistant:

static EnumValue::value_type read_enum(ElementType type, byte_view& data)
        {
            switch (type)
            {
            case ElementType::Boolean:
                return read<bool>(data);

            case ElementType::Char:
                return read<char16_t>(data);

            case ElementType::I1:
                return read<int8_t>(data);

            case ElementType::U1:
                return read<uint8_t>(data);

            case ElementType::I2:
                return read<int16_t>(data);

            case ElementType::U2:
                return read<uint16_t>(data);

            case ElementType::I4:
                return read<int32_t>(data);

            case ElementType::U4:
                return read<uint32_t>(data);

            case ElementType::I8:
                return read<int64_t>(data);

            case ElementType::U8:
                return read<uint64_t>(data);

            default:
                impl::throw_invalid("Invalid underling enum type encountered");
            }
        }